

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseField(WastParser *this,Field *field)

{
  bool bVar1;
  Result RVar2;
  undefined1 local_30 [8];
  anon_class_16_2_f7c7e1e7 parse_mut_valuetype;
  Field *field_local;
  WastParser *this_local;
  
  parse_mut_valuetype.this = (WastParser *)&parse_mut_valuetype.field;
  local_30 = (undefined1  [8])this;
  parse_mut_valuetype.field = (Field **)field;
  bVar1 = MatchLpar(this,Field);
  if (bVar1) {
    ParseBindVarOpt(this,(string *)parse_mut_valuetype.field);
    RVar2 = ParseField::anon_class_16_2_f7c7e1e7::operator()((anon_class_16_2_f7c7e1e7 *)local_30);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  else {
    RVar2 = ParseField::anon_class_16_2_f7c7e1e7::operator()((anon_class_16_2_f7c7e1e7 *)local_30);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseField(Field* field) {
  WABT_TRACE(ParseField);
  auto parse_mut_valuetype = [&]() -> Result {
    // TODO: Share with ParseGlobalType?
    if (MatchLpar(TokenType::Mut)) {
      field->mutable_ = true;
      CHECK_RESULT(ParseValueType(&field->type));
      EXPECT(Rpar);
    } else {
      field->mutable_ = false;
      CHECK_RESULT(ParseValueType(&field->type));
    }
    return Result::Ok;
  };

  if (MatchLpar(TokenType::Field)) {
    ParseBindVarOpt(&field->name);
    CHECK_RESULT(parse_mut_valuetype());
    EXPECT(Rpar);
  } else {
    CHECK_RESULT(parse_mut_valuetype());
  }

  return Result::Ok;
}